

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternTest.cpp
# Opt level: O2

bool __thiscall
PatternTest::TestOnePattern
          (PatternTest *this,char **test_strings,size_t nb_test_strings,uint32_t pattern)

{
  uint8_t *str;
  bool bVar1;
  size_t len;
  size_t i;
  ulong uVar2;
  uint32_t flags;
  uint8_t val [64];
  uint32_t local_7c;
  uint8_t local_78 [72];
  
  bVar1 = true;
  for (uVar2 = 0; (bVar1 != false && (uVar2 < nb_test_strings)); uVar2 = uVar2 + 1) {
    local_7c = 0;
    str = (uint8_t *)test_strings[uVar2];
    len = strlen((char *)str);
    bVar1 = NamePattern::Preprocess(str,len,local_78,&local_7c);
    bVar1 = (local_7c & pattern) != 0 && bVar1;
  }
  return bVar1;
}

Assistant:

bool PatternTest::TestOnePattern(char const  ** test_strings,
    size_t nb_test_strings, uint32_t pattern)
{
    bool ret = true;
    uint8_t val[64];
    uint32_t flags;
    size_t len;

    for (size_t i = 0; ret && i < nb_test_strings; i++)
    {
        flags = 0;
        len = strlen(test_strings[i]);
        if (!NamePattern::Preprocess((uint8_t *)test_strings[i], len, val, &flags))
        {
            ret = false;
        }
        else if ((flags&pattern) == 0)
        {
            ret = false;
        }
    }

    return ret;
}